

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_147e942::BIP32PubkeyProvider::GetDerivedExtKey
          (BIP32PubkeyProvider *this,SigningProvider *arg,CExtKey *xprv,CExtKey *last_hardened)

{
  long lVar1;
  uint *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  uchar uVar6;
  uchar uVar7;
  uchar uVar8;
  uchar uVar9;
  uchar uVar10;
  undefined3 uVar11;
  uchar uVar12;
  uchar uVar13;
  uchar uVar14;
  uchar uVar15;
  bool bVar16;
  bool bVar17;
  uint uVar18;
  uint *puVar19;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar16 = GetExtKey(this,arg,xprv);
  if (bVar16) {
    puVar19 = (this->m_path).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_start;
    puVar2 = (this->m_path).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    bVar16 = puVar19 == puVar2;
    if (!bVar16) {
      uVar18 = *puVar19;
      bVar17 = CExtKey::Derive(xprv,xprv,uVar18);
      if (bVar17) {
        do {
          puVar19 = puVar19 + 1;
          if ((int)uVar18 < 0) {
            uVar6 = xprv->nDepth;
            uVar7 = xprv->vchFingerprint[0];
            uVar8 = xprv->vchFingerprint[1];
            uVar9 = xprv->vchFingerprint[2];
            uVar10 = xprv->vchFingerprint[3];
            uVar11 = *(undefined3 *)&xprv->field_0x5;
            uVar18 = xprv->nChild;
            uVar12 = (xprv->chaincode).super_base_blob<256U>.m_data._M_elems[0];
            uVar13 = (xprv->chaincode).super_base_blob<256U>.m_data._M_elems[1];
            uVar14 = (xprv->chaincode).super_base_blob<256U>.m_data._M_elems[2];
            uVar15 = (xprv->chaincode).super_base_blob<256U>.m_data._M_elems[3];
            uVar3 = *(undefined8 *)((xprv->chaincode).super_base_blob<256U>.m_data._M_elems + 4);
            uVar4 = *(undefined8 *)((xprv->chaincode).super_base_blob<256U>.m_data._M_elems + 0xc);
            uVar5 = *(undefined8 *)((xprv->chaincode).super_base_blob<256U>.m_data._M_elems + 0x18);
            *(undefined8 *)((last_hardened->chaincode).super_base_blob<256U>.m_data._M_elems + 0x10)
                 = *(undefined8 *)((xprv->chaincode).super_base_blob<256U>.m_data._M_elems + 0x10);
            *(undefined8 *)((last_hardened->chaincode).super_base_blob<256U>.m_data._M_elems + 0x18)
                 = uVar5;
            *(undefined8 *)((last_hardened->chaincode).super_base_blob<256U>.m_data._M_elems + 4) =
                 uVar3;
            *(undefined8 *)((last_hardened->chaincode).super_base_blob<256U>.m_data._M_elems + 0xc)
                 = uVar4;
            last_hardened->nDepth = uVar6;
            last_hardened->vchFingerprint[0] = uVar7;
            last_hardened->vchFingerprint[1] = uVar8;
            last_hardened->vchFingerprint[2] = uVar9;
            last_hardened->vchFingerprint[3] = uVar10;
            *(undefined3 *)&last_hardened->field_0x5 = uVar11;
            last_hardened->nChild = uVar18;
            (last_hardened->chaincode).super_base_blob<256U>.m_data._M_elems[0] = uVar12;
            (last_hardened->chaincode).super_base_blob<256U>.m_data._M_elems[1] = uVar13;
            (last_hardened->chaincode).super_base_blob<256U>.m_data._M_elems[2] = uVar14;
            (last_hardened->chaincode).super_base_blob<256U>.m_data._M_elems[3] = uVar15;
            CKey::operator=(&last_hardened->key,&xprv->key);
          }
          if ((bVar17 == false) || (bVar16 = puVar19 == puVar2, bVar16)) break;
          uVar18 = *puVar19;
          bVar17 = CExtKey::Derive(xprv,xprv,uVar18);
        } while (bVar17);
      }
    }
  }
  else {
    bVar16 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar16;
}

Assistant:

bool GetDerivedExtKey(const SigningProvider& arg, CExtKey& xprv, CExtKey& last_hardened) const
    {
        if (!GetExtKey(arg, xprv)) return false;
        for (auto entry : m_path) {
            if (!xprv.Derive(xprv, entry)) return false;
            if (entry >> 31) {
                last_hardened = xprv;
            }
        }
        return true;
    }